

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O1

void kca_project_inertia(kca_joint *joint,ma_abi *m,ma_abi *r)

{
  frame *pfVar1;
  point *ppVar2;
  
  if (joint == (kca_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x6d,
                  "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
                 );
  }
  if (m == (ma_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x6e,
                  "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
                 );
  }
  if (r == (ma_abi *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x6f,
                  "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
                 );
  }
  if (m == r) {
    __assert_fail("m != r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x70,
                  "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
                 );
  }
  pfVar1 = m->frame;
  if (pfVar1 == (frame *)0x0) {
    __assert_fail("m->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x71,
                  "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
                 );
  }
  ppVar2 = m->point;
  if (ppVar2 != pfVar1->origin) {
    __assert_fail("m->point == m->frame->origin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x72,
                  "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
                 );
  }
  if (joint->target_body != m->body) {
    __assert_fail("joint->target_body == m->body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x73,
                  "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
                 );
  }
  if (joint->target_frame == pfVar1) {
    r->body = joint->reference_body;
    r->point = ppVar2;
    r->frame = pfVar1;
    return;
  }
  __assert_fail("joint->target_frame == m->frame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x74,
                "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
               );
}

Assistant:

void kca_project_inertia(
        const struct kca_joint *joint,
        const struct ma_abi *m,
        struct ma_abi *r)
{
    assert(joint);
    assert(m);
    assert(r);
    assert(m != r);
    assert(m->frame);
    assert(m->point == m->frame->origin);
    assert(joint->target_body == m->body);
    assert(joint->target_frame == m->frame);

    r->body = joint->reference_body;
    r->point = m->point;
    r->frame = m->frame;
}